

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase414::run(TestCase414 *this)

{
  FsNode *pFVar1;
  size_t sVar2;
  EVP_PKEY_CTX *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar7;
  char *__n;
  char *ptrCopy;
  char *pcVar8;
  char *__s1;
  bool bVar9;
  StringPtr text;
  StringPtr text_00;
  Own<kj::File,_std::nullptr_t> dest;
  String bigString;
  Own<kj::File,_std::nullptr_t> source;
  DebugComparison<unsigned_long,_int> _kjCondition;
  TestClock clock;
  undefined8 *local_d8;
  FsNode *local_d0;
  String local_c8;
  String local_a8;
  undefined8 *local_88;
  EVP_PKEY_CTX *local_80;
  undefined1 local_78 [32];
  char *local_58;
  bool local_50;
  bool local_48;
  TestClock local_40;
  
  local_40.super_Clock._vptr_Clock = (_func_int **)&PTR_now_00611890;
  local_40.time.value.value = (Quantity<long,_kj::_::NanosecondLabel>)1000000000;
  newInMemoryFile((kj *)&local_88,&local_40.super_Clock);
  text.content.size_ = 10;
  text.content.ptr = "foobarbaz";
  File::writeAll((File *)local_80,text);
  newInMemoryFile((kj *)&local_d8,&local_40.super_Clock);
  text_00.content.size_ = 9;
  text_00.content.ptr = "quxcorge";
  File::writeAll((File *)local_d0,text_00);
  TestClock::expectChanged(&local_40,local_d0);
  iVar6 = File::copy((File *)local_d0,(EVP_PKEY_CTX *)0x3,local_80);
  local_78._0_8_ = CONCAT44(extraout_var,iVar6);
  local_78._8_4_ = 3;
  local_78._16_8_ = " == ";
  local_78._24_8_ = &DAT_00000005;
  local_58 = (char *)CONCAT71(local_58._1_7_,(char *)local_78._0_8_ == (char *)0x3);
  if (((char *)local_78._0_8_ != (char *)0x3) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[68],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1a8,ERROR,
               "\"failed: expected \" \"dest->File::copy(3, *source, 6, kj::maxValue) == 3\", _kjCondition"
               ,(char (*) [68])"failed: expected dest->File::copy(3, *source, 6, kj::maxValue) == 3"
               ,(DebugComparison<unsigned_long,_int> *)local_78);
  }
  TestClock::expectChanged(&local_40,local_d0);
  ReadableFile::readAllText(&local_a8,(ReadableFile *)local_d0);
  local_c8.content.ptr = local_a8.content.ptr;
  local_c8.content.size_ = local_a8.content.size_;
  local_c8.content.disposer = local_a8.content.disposer;
  local_a8.content.ptr = (char *)0x0;
  local_a8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[9]> *)local_78,
             (DebugExpression<kj::String> *)&local_c8,(char (*) [9])"quxbazge");
  sVar2 = local_c8.content.size_;
  pcVar7 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  sVar2 = local_a8.content.size_;
  pcVar7 = local_a8.content.ptr;
  if (local_a8.content.ptr != (char *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  if ((local_48 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1aa,ERROR,
               "\"failed: expected \" \"dest->readAllText() == \\\"quxbazge\\\"\", _kjCondition",
               (char (*) [51])"failed: expected dest->readAllText() == \"quxbazge\"",
               (DebugComparison<kj::String,_const_char_(&)[9]> *)local_78);
  }
  uVar5 = local_78._8_8_;
  uVar4 = local_78._0_8_;
  if ((char *)local_78._0_8_ != (char *)0x0) {
    local_78._0_8_ = (char *)0x0;
    local_78._8_8_ = 0;
    (**(_func_int **)((Array<char> *)local_78._16_8_)->ptr)(local_78._16_8_,uVar4,1,uVar5,uVar5,0);
  }
  iVar6 = File::copy((File *)local_d0,(EVP_PKEY_CTX *)0x0,local_80);
  local_78._0_8_ = CONCAT44(extraout_var_00,iVar6);
  local_78._8_4_ = 4;
  local_78._16_8_ = " == ";
  local_78._24_8_ = &DAT_00000005;
  local_58 = (char *)CONCAT71(local_58._1_7_,(undefined1 *)local_78._0_8_ == &DAT_00000004);
  if (((undefined1 *)local_78._0_8_ != &DAT_00000004) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1ac,ERROR,
               "\"failed: expected \" \"dest->File::copy(0, *source, 3, 4) == 4\", _kjCondition",
               (char (*) [57])"failed: expected dest->File::copy(0, *source, 3, 4) == 4",
               (DebugComparison<unsigned_long,_int> *)local_78);
  }
  TestClock::expectChanged(&local_40,local_d0);
  ReadableFile::readAllText(&local_a8,(ReadableFile *)local_d0);
  local_c8.content.ptr = local_a8.content.ptr;
  local_c8.content.size_ = local_a8.content.size_;
  local_c8.content.disposer = local_a8.content.disposer;
  local_a8.content.ptr = (char *)0x0;
  local_a8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[9]> *)local_78,
             (DebugExpression<kj::String> *)&local_c8,(char (*) [9])"barbazge");
  sVar2 = local_c8.content.size_;
  pcVar7 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  sVar2 = local_a8.content.size_;
  pcVar7 = local_a8.content.ptr;
  if (local_a8.content.ptr != (char *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  if ((local_48 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1ae,ERROR,
               "\"failed: expected \" \"dest->readAllText() == \\\"barbazge\\\"\", _kjCondition",
               (char (*) [51])"failed: expected dest->readAllText() == \"barbazge\"",
               (DebugComparison<kj::String,_const_char_(&)[9]> *)local_78);
  }
  uVar5 = local_78._8_8_;
  uVar4 = local_78._0_8_;
  if ((char *)local_78._0_8_ != (char *)0x0) {
    local_78._0_8_ = (char *)0x0;
    local_78._8_8_ = 0;
    (**(_func_int **)((Array<char> *)local_78._16_8_)->ptr)(local_78._16_8_,uVar4,1,uVar5,uVar5,0);
  }
  iVar6 = File::copy((File *)local_d0,(EVP_PKEY_CTX *)0x0,local_80);
  local_78._0_8_ = CONCAT44(extraout_var_01,iVar6);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_78._16_8_ = " == ";
  local_78._24_8_ = &DAT_00000005;
  bVar9 = (char *)local_78._0_8_ == (char *)0x0;
  local_58._0_1_ = bVar9;
  if ((!bVar9) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[70],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1b0,ERROR,
               "\"failed: expected \" \"dest->File::copy(0, *source, 128, kj::maxValue) == 0\", _kjCondition"
               ,(char (*) [70])
                "failed: expected dest->File::copy(0, *source, 128, kj::maxValue) == 0",
               (DebugComparison<unsigned_long,_int> *)local_78);
  }
  TestClock::expectUnchanged(&local_40,local_d0);
  pcVar7 = (char *)0x3;
  iVar6 = File::copy((File *)local_d0,(EVP_PKEY_CTX *)&DAT_00000004,local_80);
  local_78._0_8_ = CONCAT44(extraout_var_02,iVar6);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_78._16_8_ = " == ";
  local_78._24_8_ = &DAT_00000005;
  local_58 = (char *)CONCAT71(local_58._1_7_,(char *)local_78._0_8_ == (char *)0x0);
  if (((char *)local_78._0_8_ != (char *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    pcVar7 = "\"failed: expected \" \"dest->File::copy(4, *source, 3, 0) == 0\", _kjCondition";
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1b3,ERROR,
               "\"failed: expected \" \"dest->File::copy(4, *source, 3, 0) == 0\", _kjCondition",
               (char (*) [57])"failed: expected dest->File::copy(4, *source, 3, 0) == 0",
               (DebugComparison<unsigned_long,_int> *)local_78);
  }
  TestClock::expectUnchanged(&local_40,local_d0);
  local_78._0_8_ = "foobar";
  local_78._8_8_ = 10000;
  strArray<kj::Repeat<char_const*>>
            (&local_c8,(kj *)local_78,(Repeat<const_char_*> *)0x4b4903,pcVar7);
  pcVar7 = (char *)0x0;
  if ((char *)local_c8.content.size_ != (char *)0x0) {
    pcVar7 = (char *)(local_c8.content.size_ + -1);
  }
  (**(code **)(*(long *)local_80 + 0x58))(local_80,pcVar7 + 1000);
  pcVar7 = (char *)local_c8.content.size_;
  if ((char *)local_c8.content.size_ != (char *)0x0) {
    pcVar7 = local_c8.content.ptr;
  }
  pcVar8 = (char *)0x0;
  if ((char *)local_c8.content.size_ != (char *)0x0) {
    pcVar8 = (char *)(local_c8.content.size_ + -1);
  }
  (**(code **)(*(long *)local_80 + 0x48))(local_80,0x7b,pcVar7,pcVar8);
  File::copy((File *)local_d0,(EVP_PKEY_CTX *)0x141,local_80);
  ReadableFile::readAllText(&local_a8,(ReadableFile *)local_d0);
  sVar2 = local_a8.content.size_;
  pcVar7 = local_a8.content.ptr;
  pcVar8 = local_a8.content.ptr;
  if (local_a8.content.size_ == 0) {
    pcVar8 = "";
  }
  __n = (char *)((local_a8.content.size_ - 0x141) + (ulong)(local_a8.content.size_ == 0));
  pcVar8 = pcVar8 + 0x141;
  if ((char *)(local_c8.content.size_ + ((char *)local_c8.content.size_ == (char *)0x0)) == __n) {
    __s1 = "";
    if ((char *)local_c8.content.size_ != (char *)0x0) {
      __s1 = local_c8.content.ptr;
    }
    iVar6 = bcmp(__s1,pcVar8,(size_t)__n);
    bVar9 = iVar6 == 0;
  }
  else {
    bVar9 = false;
  }
  local_78._24_8_ = " == ";
  local_58 = &DAT_00000005;
  local_78._0_8_ = pcVar8;
  local_78._8_8_ = __n;
  local_78._16_8_ = &local_c8;
  local_50 = bVar9;
  if (pcVar7 != (char *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  if ((bVar9 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::StringPtr,kj::String&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1bb,ERROR,
               "\"failed: expected \" \"dest->readAllText().slice(321) == bigString\", _kjCondition"
               ,(char (*) [61])"failed: expected dest->readAllText().slice(321) == bigString",
               (DebugComparison<kj::StringPtr,_kj::String_&> *)local_78);
  }
  sVar2 = local_c8.content.size_;
  pcVar7 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar7,1,sVar2,sVar2,0);
  }
  pFVar1 = local_d0;
  if (local_d0 != (FsNode *)0x0) {
    local_d0 = (FsNode *)0x0;
    (**(code **)*local_d8)(local_d8,pFVar1->_vptr_FsNode[-2] + (long)&pFVar1->_vptr_FsNode);
  }
  pEVar3 = local_80;
  if (local_80 != (EVP_PKEY_CTX *)0x0) {
    local_80 = (EVP_PKEY_CTX *)0x0;
    (**(code **)*local_88)(local_88,pEVar3 + *(long *)(*(long *)pEVar3 + -0x10));
  }
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }